

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void __thiscall
FRemapTable::AddColorRange
          (FRemapTable *this,int start,int end,int _r1,int _g1,int _b1,int _r2,int _g2,int _b2)

{
  byte bVar1;
  undefined1 auVar2 [16];
  double dVar3;
  BYTE BVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_70;
  undefined1 local_68 [40];
  double dStack_40;
  
  dVar8 = (double)_g1;
  dStack_40 = (double)_r1;
  dVar9 = (double)_b1;
  dVar10 = (double)_g2;
  dVar3 = (double)_r2;
  dVar11 = (double)_b2;
  if (end < start) {
    local_70 = dVar9 - dVar11;
    local_68._8_8_ = dStack_40 - dVar3;
    local_68._0_8_ = dVar8 - dVar10;
    dVar9 = dVar11;
    iVar5 = start;
    iVar6 = end;
    dVar8 = dVar10;
    dStack_40 = dVar3;
  }
  else {
    local_70 = dVar11 - dVar9;
    local_68._8_4_ = SUB84(dVar3 - dStack_40,0);
    local_68._0_8_ = dVar10 - dVar8;
    local_68._12_4_ = (int)((ulong)(dVar3 - dStack_40) >> 0x20);
    iVar5 = end;
    iVar6 = start;
  }
  if (end == start) {
    bVar1 = GPalette.Remap[iVar6];
    this->Palette[bVar1].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         ((uint)(bVar1 == 0) * 0x1000000 +
          ((int)dVar9 & 0xffU | ((int)dVar8 & 0xffU) << 8 | ((int)dStack_40 & 0xffU) << 0x10) +
         -0x1000000);
    BVar4 = FColorMatcher::Pick(&ColorMatcher,(PalEntry)this->Palette[bVar1].field_0.field_0);
    this->Remap[bVar1] = BVar4;
  }
  else {
    dVar10 = 1.0 / (double)(iVar5 - iVar6);
    if (end < start) {
      start = end;
    }
    lVar7 = (long)start;
    while( true ) {
      if (iVar5 < lVar7) break;
      bVar1 = GPalette.Remap[lVar7];
      this->Palette[bVar1].field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           ((((int)dStack_40 & 0xffU) << 0x10 | ((int)dVar8 & 0xffU) << 8 | (int)dVar9 & 0xffU |
            (uint)(bVar1 == 0) << 0x18) - 0x1000000);
      auVar2._8_4_ = SUB84(dStack_40,0);
      auVar2._0_8_ = dVar8;
      auVar2._12_4_ = (int)((ulong)dStack_40 >> 0x20);
      BVar4 = FColorMatcher::Pick(&ColorMatcher,(PalEntry)this->Palette[bVar1].field_0.field_0);
      dStack_40 = auVar2._8_8_;
      this->Remap[bVar1] = BVar4;
      dVar8 = dVar8 + (double)local_68._0_8_ * dVar10;
      dStack_40 = dStack_40 + (double)local_68._8_8_ * dVar10;
      dVar9 = dVar9 + local_70 / (double)(iVar5 - iVar6);
      lVar7 = lVar7 + 1;
    }
  }
  return;
}

Assistant:

void FRemapTable::AddColorRange(int start, int end, int _r1,int _g1, int _b1, int _r2, int _g2, int _b2)
{
	double r1 = _r1;
	double g1 = _g1;
	double b1 = _b1;
	double r2 = _r2;
	double g2 = _g2;
	double b2 = _b2;
	double r, g, b;
	double rs, gs, bs;

	if (start > end)
	{
		swapvalues (start, end);
		r = r2;
		g = g2;
		b = b2;
		rs = r1 - r2;
		gs = g1 - g2;
		bs = b1 - b2;
	}
	else
	{
		r = r1;
		g = g1;
		b = b1;
		rs = r2 - r1;
		gs = g2 - g1;
		bs = b2 - b1;
	}
	if (start == end)
	{
		start = GPalette.Remap[start];
		Palette[start] = PalEntry(start == 0 ? 0 : 255, int(r), int(g), int(b));
		Remap[start] = ColorMatcher.Pick(Palette[start]);
	}
	else
	{
		rs /= (end - start);
		gs /= (end - start);
		bs /= (end - start);
		for (int i = start; i <= end; ++i)
		{
			int j = GPalette.Remap[i];
			Palette[j] = PalEntry(j == 0 ? 0 : 255, int(r), int(g), int(b));
			Remap[j] = ColorMatcher.Pick(Palette[j]);
			r += rs;
			g += gs;
			b += bs;
		}
	}
}